

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_freeCCtx(ZSTD_CCtx *cctx)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  long in_RDI;
  void *unaff_retaddr;
  ZSTD_CDict *in_stack_00000008;
  undefined8 in_stack_fffffffffffffff8;
  size_t sVar1;
  
  if (in_RDI == 0) {
    sVar1 = 0;
  }
  else if (*(long *)(in_RDI + 0x1a8) == 0) {
    customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffff8;
    customMem.customAlloc = (ZSTD_allocFunction)in_RDI;
    customMem.opaque = unaff_retaddr;
    ZSTD_free(*(void **)(in_RDI + 0x198),customMem);
    *(undefined8 *)(in_RDI + 0x108) = 0;
    ZSTD_freeCDict(in_stack_00000008);
    *(undefined8 *)(in_RDI + 0x368) = 0;
    customMem_00.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffff8;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_RDI;
    customMem_00.opaque = unaff_retaddr;
    ZSTD_free(*(void **)(in_RDI + 0x198),customMem_00);
    sVar1 = 0;
  }
  else {
    sVar1 = 0xffffffffffffffc0;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_freeCCtx(ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support free on NULL */
    if (cctx->staticSize) return ERROR(memory_allocation);   /* not compatible with static CCtx */
    ZSTD_free(cctx->workSpace, cctx->customMem); cctx->workSpace = NULL;
    ZSTD_freeCDict(cctx->cdictLocal); cctx->cdictLocal = NULL;
#ifdef ZSTD_MULTITHREAD
    ZSTDMT_freeCCtx(cctx->mtctx); cctx->mtctx = NULL;
#endif
    ZSTD_free(cctx, cctx->customMem);
    return 0;   /* reserved as a potential error code in the future */
}